

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
read_file_u8(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
            string *file_name)

{
  FILE *__stream;
  long __off;
  long lVar1;
  size_t sVar2;
  size_type __new_size;
  string local_40;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_40,(string *)file_name);
  __stream = (FILE *)fopen_or_fail(&local_40,"rb");
  std::__cxx11::string::~string((string *)&local_40);
  __off = ftell(__stream);
  fseek(__stream,0,2);
  lVar1 = ftell(__stream);
  __new_size = lVar1 - __off;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,__new_size);
  fseek(__stream,__off,0);
  sVar2 = fread((__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start,1,__new_size,__stream);
  if (sVar2 == __new_size) {
    fclose_or_fail((FILE *)__stream);
    return __return_storage_ptr__;
  }
  quit("reading file content failed: %d",sVar2);
}

Assistant:

std::vector<uint8_t> read_file_u8(std::string file_name)
{
    std::vector<uint8_t> content;
    auto f = fopen_or_fail(file_name, "rb");
    auto cur = ftell(f);
    fseek(f, 0, SEEK_END);
    auto end = ftell(f);
    size_t file_size = (end - cur);
    content.resize(file_size);
    fseek(f, cur, SEEK_SET);
    size_t ret = fread(content.data(), sizeof(uint8_t), file_size, f);
    if (ret != file_size) {
        quit("reading file content failed: %d", ret);
    }
    fclose_or_fail(f);
    return content;
}